

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

unsigned_long * __thiscall
google::protobuf::internal::UntypedMapBase::GetKey<unsigned_long>
          (UntypedMapBase *this,NodeBase *node)

{
  Nonnull<const_char_*> pcVar1;
  ulong v2;
  
  v2 = (ulong)((byte)(this->type_info_).field_0x3 & 0xf);
  if (v2 == 2) {
    pcVar1 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (2,v2,
                        "static_cast<int>(StaticTypeKind<T>()) == static_cast<int>(type_info_.key_type)"
                       );
  }
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    return (unsigned_long *)(node + 1);
  }
  GetKey<unsigned_long>();
}

Assistant:

T* GetKey(NodeBase* node) const {
    // Debug check that `T` matches what we expect from the type info.
    ABSL_DCHECK_EQ(static_cast<int>(StaticTypeKind<T>()),
                   static_cast<int>(type_info_.key_type));
    return reinterpret_cast<T*>(node->GetVoidKey());
  }